

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaLoader::FillMaterials(ColladaLoader *this,ColladaParser *pParser,aiScene *param_2)

{
  ai_real *pInput;
  float fVar1;
  Effect *effect;
  aiMaterial *this_00;
  ColladaParser *pParser_00;
  Logger *this_01;
  pair<Assimp::Collada::Effect_*,_aiMaterial_*> *elem;
  pointer ppVar2;
  int shadeMode;
  ColladaParser *local_40;
  pointer local_38;
  
  ppVar2 = (this->newMats).
           super__Vector_base<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->newMats).
             super__Vector_base<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = pParser;
  do {
    if (ppVar2 == local_38) {
      return;
    }
    effect = ppVar2->first;
    this_00 = ppVar2->second;
    if (effect->mFaceted == true) {
      shadeMode = 1;
    }
    else {
      switch(effect->mShadeType) {
      case Shade_Constant:
        shadeMode = 9;
        break;
      case Shade_Phong:
        shadeMode = 3;
        break;
      case Shade_Blinn:
        shadeMode = 4;
        break;
      default:
        this_01 = DefaultLogger::get();
        Logger::warn(this_01,"Collada: Unrecognized shading mode, using gouraud shading");
      case Shade_Lambert:
        shadeMode = 2;
      }
    }
    aiMaterial::AddProperty<int>(this_00,&shadeMode,1,"$mat.shadingm",0,0);
    shadeMode = (int)effect->mDoubleSided;
    aiMaterial::AddProperty<int>(this_00,&shadeMode,1,"$mat.twosided",0,0);
    shadeMode = (int)effect->mWireframe;
    aiMaterial::AddProperty<int>(this_00,&shadeMode,1,"$mat.wireframe",0,0);
    aiMaterial::AddProperty(this_00,&effect->mAmbient,1,"$clr.ambient",0,0);
    aiMaterial::AddProperty(this_00,&effect->mDiffuse,1,"$clr.diffuse",0,0);
    aiMaterial::AddProperty(this_00,&effect->mSpecular,1,"$clr.specular",0,0);
    aiMaterial::AddProperty(this_00,&effect->mEmissive,1,"$clr.emissive",0,0);
    aiMaterial::AddProperty(this_00,&effect->mReflective,1,"$clr.reflective",0,0);
    aiMaterial::AddProperty(this_00,&effect->mShininess,1,"$mat.shininess",0,0);
    aiMaterial::AddProperty(this_00,&effect->mReflectivity,1,"$mat.reflectivity",0,0);
    aiMaterial::AddProperty(this_00,&effect->mRefractIndex,1,"$mat.refracti",0,0);
    pParser_00 = local_40;
    fVar1 = effect->mTransparency;
    if ((0.0 <= fVar1) && (fVar1 <= 1.0)) {
      if (effect->mRGBTransparency == true) {
        effect->mTransparency =
             fVar1 * ((effect->mTransparent).b * 0.072169 +
                     (effect->mTransparent).r * 0.212671 + (effect->mTransparent).g * 0.71516);
        (effect->mTransparent).a = 1.0;
        aiMaterial::AddProperty(this_00,&effect->mTransparent,1,"$clr.transparent",0,0);
      }
      else {
        effect->mTransparency = fVar1 * (effect->mTransparent).a;
      }
      pInput = &effect->mTransparency;
      if (effect->mInvertTransparency == true) {
        *pInput = 1.0 - *pInput;
      }
      if ((effect->mHasTransparency != false) || (*pInput <= 1.0 && *pInput != 1.0)) {
        aiMaterial::AddProperty(this_00,pInput,1,"$mat.opacity",0,0);
      }
    }
    if ((effect->mTexAmbient).mName._M_string_length != 0) {
      AddTexture(this,this_00,pParser_00,effect,&effect->mTexAmbient,aiTextureType_LIGHTMAP,0);
    }
    if ((effect->mTexEmissive).mName._M_string_length != 0) {
      AddTexture(this,this_00,pParser_00,effect,&effect->mTexEmissive,aiTextureType_EMISSIVE,0);
    }
    if ((effect->mTexSpecular).mName._M_string_length != 0) {
      AddTexture(this,this_00,pParser_00,effect,&effect->mTexSpecular,aiTextureType_SPECULAR,0);
    }
    if ((effect->mTexDiffuse).mName._M_string_length != 0) {
      AddTexture(this,this_00,pParser_00,effect,&effect->mTexDiffuse,aiTextureType_DIFFUSE,0);
    }
    if ((effect->mTexBump).mName._M_string_length != 0) {
      AddTexture(this,this_00,pParser_00,effect,&effect->mTexBump,aiTextureType_NORMALS,0);
    }
    if ((effect->mTexTransparent).mName._M_string_length != 0) {
      AddTexture(this,this_00,pParser_00,effect,&effect->mTexTransparent,aiTextureType_OPACITY,0);
    }
    if ((effect->mTexReflective).mName._M_string_length != 0) {
      AddTexture(this,this_00,pParser_00,effect,&effect->mTexReflective,aiTextureType_REFLECTION,0);
    }
    ppVar2 = ppVar2 + 1;
  } while( true );
}

Assistant:

void ColladaLoader::FillMaterials(const ColladaParser& pParser, aiScene* /*pScene*/)
{
    for (auto &elem : newMats)
    {
        aiMaterial&  mat = (aiMaterial&)*elem.second;
        Collada::Effect& effect = *elem.first;

        // resolve shading mode
        int shadeMode;
        if (effect.mFaceted) /* fixme */
            shadeMode = aiShadingMode_Flat;
        else {
            switch (effect.mShadeType)
            {
            case Collada::Shade_Constant:
                shadeMode = aiShadingMode_NoShading;
                break;
            case Collada::Shade_Lambert:
                shadeMode = aiShadingMode_Gouraud;
                break;
            case Collada::Shade_Blinn:
                shadeMode = aiShadingMode_Blinn;
                break;
            case Collada::Shade_Phong:
                shadeMode = aiShadingMode_Phong;
                break;

            default:
                ASSIMP_LOG_WARN("Collada: Unrecognized shading mode, using gouraud shading");
                shadeMode = aiShadingMode_Gouraud;
                break;
            }
        }
        mat.AddProperty<int>(&shadeMode, 1, AI_MATKEY_SHADING_MODEL);

        // double-sided?
        shadeMode = effect.mDoubleSided;
        mat.AddProperty<int>(&shadeMode, 1, AI_MATKEY_TWOSIDED);

        // wireframe?
        shadeMode = effect.mWireframe;
        mat.AddProperty<int>(&shadeMode, 1, AI_MATKEY_ENABLE_WIREFRAME);

        // add material colors
        mat.AddProperty(&effect.mAmbient, 1, AI_MATKEY_COLOR_AMBIENT);
        mat.AddProperty(&effect.mDiffuse, 1, AI_MATKEY_COLOR_DIFFUSE);
        mat.AddProperty(&effect.mSpecular, 1, AI_MATKEY_COLOR_SPECULAR);
        mat.AddProperty(&effect.mEmissive, 1, AI_MATKEY_COLOR_EMISSIVE);
        mat.AddProperty(&effect.mReflective, 1, AI_MATKEY_COLOR_REFLECTIVE);

        // scalar properties
        mat.AddProperty(&effect.mShininess, 1, AI_MATKEY_SHININESS);
        mat.AddProperty(&effect.mReflectivity, 1, AI_MATKEY_REFLECTIVITY);
        mat.AddProperty(&effect.mRefractIndex, 1, AI_MATKEY_REFRACTI);

        // transparency, a very hard one. seemingly not all files are following the
        // specification here (1.0 transparency => completely opaque)...
        // therefore, we let the opportunity for the user to manually invert
        // the transparency if necessary and we add preliminary support for RGB_ZERO mode
        if (effect.mTransparency >= 0.f && effect.mTransparency <= 1.f) {
            // handle RGB transparency completely, cf Collada specs 1.5.0 pages 249 and 304
            if (effect.mRGBTransparency) {
                // use luminance as defined by ISO/CIE color standards (see ITU-R Recommendation BT.709-4)
                effect.mTransparency *= (
                    0.212671f * effect.mTransparent.r +
                    0.715160f * effect.mTransparent.g +
                    0.072169f * effect.mTransparent.b
                    );

                effect.mTransparent.a = 1.f;

                mat.AddProperty(&effect.mTransparent, 1, AI_MATKEY_COLOR_TRANSPARENT);
            }
            else {
                effect.mTransparency *= effect.mTransparent.a;
            }

            if (effect.mInvertTransparency) {
                effect.mTransparency = 1.f - effect.mTransparency;
            }

            // Is the material finally transparent ?
            if (effect.mHasTransparency || effect.mTransparency < 1.f) {
                mat.AddProperty(&effect.mTransparency, 1, AI_MATKEY_OPACITY);
            }
        }

        // add textures, if given
        if (!effect.mTexAmbient.mName.empty()) {
            // It is merely a light-map
            AddTexture(mat, pParser, effect, effect.mTexAmbient, aiTextureType_LIGHTMAP);
        }

        if (!effect.mTexEmissive.mName.empty())
            AddTexture(mat, pParser, effect, effect.mTexEmissive, aiTextureType_EMISSIVE);

        if (!effect.mTexSpecular.mName.empty())
            AddTexture(mat, pParser, effect, effect.mTexSpecular, aiTextureType_SPECULAR);

        if (!effect.mTexDiffuse.mName.empty())
            AddTexture(mat, pParser, effect, effect.mTexDiffuse, aiTextureType_DIFFUSE);

        if (!effect.mTexBump.mName.empty())
            AddTexture(mat, pParser, effect, effect.mTexBump, aiTextureType_NORMALS);

        if (!effect.mTexTransparent.mName.empty())
            AddTexture(mat, pParser, effect, effect.mTexTransparent, aiTextureType_OPACITY);

        if (!effect.mTexReflective.mName.empty())
            AddTexture(mat, pParser, effect, effect.mTexReflective, aiTextureType_REFLECTION);
    }
}